

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_propertyi(nk_context *ctx,char *name,int min,int val,int max,int step,float inc_per_pixel)

{
  nk_property_variant local_30;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4dca,
                  "int nk_propertyi(struct nk_context *, const char *, int, int, int, int, float)");
  }
  if (name != (char *)0x0) {
    if (ctx->current != (nk_window *)0x0) {
      local_30.kind = NK_PROPERTY_INT;
      local_30.value.i = val;
      local_30.min_value.i = min;
      local_30.max_value.i = max;
      local_30.step.i = step;
      nk_property(ctx,name,&local_30,inc_per_pixel,NK_FILTER_INT);
      val = local_30.value.i;
    }
    return val;
  }
  __assert_fail("name",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                ,0x4dcb,
                "int nk_propertyi(struct nk_context *, const char *, int, int, int, int, float)");
}

Assistant:

NK_API int
nk_propertyi(struct nk_context *ctx, const char *name, int min, int val,
    int max, int step, float inc_per_pixel)
{
    struct nk_property_variant variant;
    NK_ASSERT(ctx);
    NK_ASSERT(name);

    if (!ctx || !ctx->current || !name) return val;
    variant = nk_property_variant_int(val, min, max, step);
    nk_property(ctx, name, &variant, inc_per_pixel, NK_FILTER_INT);
    val = variant.value.i;
    return val;
}